

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::GetToken(Token *__return_storage_ptr__,WastLexer *this,WastParser *parser)

{
  byte bVar1;
  bool bVar2;
  char *saved_cursor;
  byte *pbVar3;
  byte *pbVar4;
  size_type sVar5;
  TokenType TVar6;
  byte *pbVar7;
  byte *pbVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  anon_class_8_1_8991fb9c column;
  string_view name;
  
  pbVar4 = (byte *)this->buffer_end_;
  pbVar3 = (byte *)this->cursor_;
  this->token_start_ = (char *)pbVar3;
  if (pbVar4 <= pbVar3) {
LAB_0015502e:
    TVar6 = Eof;
LAB_00155039:
    BareToken(__return_storage_ptr__,this,TVar6);
    return __return_storage_ptr__;
  }
LAB_00154e4f:
  bVar1 = *pbVar3;
  if (bVar1 < 0x61) {
    switch(bVar1) {
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      ReadWhitespace(this);
      break;
    default:
      goto switchD_00154e6f_caseD_b;
    case 0x22:
      GetStringToken(__return_storage_ptr__,this,parser);
      return __return_storage_ptr__;
    case 0x24:
      GetIdToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x28:
      lVar10 = 0;
      pbVar7 = pbVar3;
      do {
        uVar11 = 0xffffffff;
        pbVar8 = pbVar7;
        if (pbVar7 < pbVar4) {
          pbVar8 = pbVar7 + 1;
          this->cursor_ = (char *)pbVar8;
          uVar11 = (uint)*pbVar7;
        }
        if (uVar11 != (int)"(;"[lVar10]) {
          this->cursor_ = (char *)pbVar3;
          lVar10 = 0;
          pbVar7 = pbVar3;
          goto LAB_00155067;
        }
        lVar10 = lVar10 + 1;
        pbVar7 = pbVar8;
      } while (lVar10 != 2);
      bVar2 = ReadBlockComment(this,parser);
      if (!bVar2) goto LAB_0015502e;
      break;
    case 0x29:
      this->cursor_ = (char *)(pbVar3 + 1);
      TVar6 = Rpar;
      goto LAB_00155039;
    case 0x2b:
    case 0x2d:
      pbVar3 = pbVar3 + 1;
      this->cursor_ = (char *)pbVar3;
      if (pbVar4 <= pbVar3) goto LAB_00155259;
      bVar1 = *pbVar3;
      if (bVar1 - 0x31 < 9) goto LAB_00155100;
      if (bVar1 == 0x6e) goto LAB_00155279;
      if (bVar1 == 0x69) goto LAB_00155269;
      if (bVar1 == 0x30) {
        lVar10 = 0;
        pbVar7 = pbVar3;
        goto LAB_0015521c;
      }
LAB_00155259:
      GetReservedToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x30:
      lVar10 = 0;
      pbVar7 = pbVar3;
      goto LAB_0015511c;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      goto switchD_00154e6f_caseD_31;
    case 0x3b:
      lVar10 = 0;
      pbVar7 = pbVar3;
      do {
        uVar11 = 0xffffffff;
        pbVar8 = pbVar7;
        if (pbVar7 < pbVar4) {
          pbVar8 = pbVar7 + 1;
          this->cursor_ = (char *)pbVar8;
          uVar11 = (uint)*pbVar7;
        }
        if (uVar11 != (int)";;"[lVar10]) {
          this->cursor_ = (char *)(pbVar3 + 1);
          goto LAB_00154fff;
        }
        lVar10 = lVar10 + 1;
        pbVar7 = pbVar8;
      } while (lVar10 != 2);
      do {
        if (pbVar4 <= pbVar8) goto LAB_0015502e;
        pbVar3 = pbVar8 + 1;
        this->cursor_ = (char *)pbVar3;
        bVar1 = *pbVar8;
        pbVar8 = pbVar3;
      } while (bVar1 != 10);
      this->line_ = this->line_ + 1;
      this->line_start_ = (char *)pbVar3;
    }
  }
  else {
    if (bVar1 < 0x6e) {
      if (bVar1 == 0x61) {
        pcVar9 = "align=";
        sVar5 = 6;
        TVar6 = AlignEqNat;
LAB_001551ce:
        name.size_ = sVar5;
        name.data_ = pcVar9;
        GetNameEqNumToken(__return_storage_ptr__,this,name,TVar6);
        return __return_storage_ptr__;
      }
      if (bVar1 == 0x69) {
LAB_00155269:
        GetInfToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
    }
    else {
      if (bVar1 == 0x6e) {
LAB_00155279:
        GetNanToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      if (bVar1 == 0x6f) {
        pcVar9 = "offset=";
        sVar5 = 7;
        TVar6 = OffsetEqNat;
        goto LAB_001551ce;
      }
    }
switchD_00154e6f_caseD_b:
    if ((""[(ulong)bVar1 + 1] & 2U) != 0) {
      GetKeywordToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if ((""[(ulong)bVar1 + 1] & 1U) != 0) goto LAB_00155259;
    this->cursor_ = (char *)(pbVar3 + 1);
LAB_00154fff:
    WastParser::Error(parser,0x185429);
  }
  pbVar4 = (byte *)this->buffer_end_;
  pbVar3 = (byte *)this->cursor_;
  this->token_start_ = (char *)pbVar3;
  if (pbVar4 <= pbVar3) goto LAB_0015502e;
  goto LAB_00154e4f;
  while (lVar10 = lVar10 + 1, pbVar7 = pbVar8, lVar10 != 2) {
LAB_0015511c:
    uVar11 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar4) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar11 = (uint)*pbVar7;
    }
    if (uVar11 != (int)":0x"[lVar10 + 1]) {
      this->cursor_ = (char *)pbVar3;
switchD_00154e6f_caseD_31:
      TVar6 = Last_Literal;
      goto LAB_001551f7;
    }
  }
  TVar6 = Last_Literal;
  goto LAB_00155158;
  while (lVar10 = lVar10 + 1, pbVar7 = pbVar8, lVar10 != 2) {
LAB_00155067:
    uVar11 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar4) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar11 = (uint)*pbVar7;
    }
    if (uVar11 != (int)"(@"[lVar10]) {
      this->cursor_ = (char *)(pbVar3 + 1);
      TVar6 = Lpar;
      goto LAB_00155039;
    }
  }
  if (pbVar8 < pbVar4) {
    do {
      if ((""[(ulong)*pbVar8 + 1] & 1U) == 0) break;
      pbVar8 = pbVar8 + 1;
      this->cursor_ = (char *)pbVar8;
    } while (pbVar8 != pbVar4);
  }
  TextToken(__return_storage_ptr__,this,LparAnn,2);
  return __return_storage_ptr__;
  while (lVar10 = lVar10 + 1, pbVar7 = pbVar8, lVar10 != 2) {
LAB_0015521c:
    uVar11 = 0xffffffff;
    pbVar8 = pbVar7;
    if (pbVar7 < pbVar4) {
      pbVar8 = pbVar7 + 1;
      this->cursor_ = (char *)pbVar8;
      uVar11 = (uint)*pbVar7;
    }
    if (uVar11 != (int)":0x"[lVar10 + 1]) {
      this->cursor_ = (char *)pbVar3;
LAB_00155100:
      TVar6 = Int;
LAB_001551f7:
      GetNumberToken(__return_storage_ptr__,this,TVar6);
      return __return_storage_ptr__;
    }
  }
  TVar6 = Int;
LAB_00155158:
  GetHexNumberToken(__return_storage_ptr__,this,TVar6);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetToken(WastParser* parser) {
  while (true) {
    token_start_ = cursor_;
    switch (PeekChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '(':
        if (MatchString("(;")) {
          if (ReadBlockComment(parser)) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else if (MatchString("(@")) {
          ReadReservedChars();
          // offset=2 to skip the "(@" prefix
          return TextToken(TokenType::LparAnn, 2);
        } else {
          ReadChar();
          return BareToken(TokenType::Lpar);
        }
        break;

      case ')':
        ReadChar();
        return BareToken(TokenType::Rpar);

      case ';':
        if (MatchString(";;")) {
          if (ReadLineComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
        break;

      case ' ':
      case '\t':
      case '\r':
      case '\n':
        ReadWhitespace();
        continue;

      case '"':
        return GetStringToken(parser);

      case '+':
      case '-':
        ReadChar();
        switch (PeekChar()) {
          case 'i':
            return GetInfToken();

          case 'n':
            return GetNanToken();

          case '0':
            return MatchString("0x") ? GetHexNumberToken(TokenType::Int)
                                     : GetNumberToken(TokenType::Int);
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
            return GetNumberToken(TokenType::Int);

          default:
            return GetReservedToken();
        }
        break;

      case '0':
        return MatchString("0x") ? GetHexNumberToken(TokenType::Nat)
                                 : GetNumberToken(TokenType::Nat);

      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return GetNumberToken(TokenType::Nat);

      case '$':
        return GetIdToken();

      case 'a':
        return GetNameEqNumToken("align=", TokenType::AlignEqNat);

      case 'i':
        return GetInfToken();

      case 'n':
        return GetNanToken();

      case 'o':
        return GetNameEqNumToken("offset=", TokenType::OffsetEqNat);

      default:
        if (IsKeyword(PeekChar())) {
          return GetKeywordToken();
        } else if (IsReserved(PeekChar())) {
          return GetReservedToken();
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
    }
  }
}